

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O1

int CreateRandomJumpFunc(VMFunctionBuilder *buildit,int value1,int value2)

{
  int opc;
  FState *ptr;
  
  ptr = FindState(value1);
  opc = VMFunctionBuilder::GetConstantAddress(buildit,ptr,'\a');
  VMFunctionBuilder::EmitParamInt(buildit,value2);
  VMFunctionBuilder::Emit(buildit,0x39,0,7,opc);
  return 2;
}

Assistant:

static int CreateRandomJumpFunc(VMFunctionBuilder &buildit, int value1, int value2)
{ // A_Jump
	int statereg = buildit.GetConstantAddress(FindState(value1), ATAG_STATE);

	buildit.EmitParamInt(value2);									// maxchance
	buildit.Emit(OP_PARAM, 0, REGT_POINTER | REGT_KONST, statereg);	// jumpto
	return 2;
}